

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

char mcplcfg_decode_modeflag(char *flag)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  char *__s1;
  
  if (*flag == '-') {
    bVar1 = flag[1];
    if (bVar1 == 0x2d) {
      cVar2 = flag[2];
      __s1 = flag + 2;
      if ((cVar2 == 's') && (iVar3 = strncmp(__s1,"show",5), iVar3 == 0)) {
        return 's';
      }
      if (cVar2 == 'i') {
        iVar3 = strncmp(__s1,"intversion",0xb);
        if (iVar3 == 0) {
          return 'i';
        }
      }
      else if ((cVar2 == 'v') && (iVar3 = strncmp(__s1,"version",8), iVar3 == 0)) {
        return 'v';
      }
      if ((cVar2 == 's') && (iVar3 = strncmp(__s1,"summary",8), iVar3 == 0)) {
        return 'u';
      }
      if ((cVar2 == 'h') && (iVar3 = strncmp(__s1,"help",5), iVar3 == 0)) {
        return 'h';
      }
    }
    else {
      sVar4 = strlen(flag + 1);
      if (sVar4 == 1) {
        if (bVar1 - 0x68 < 2) {
          return bVar1;
        }
        if (bVar1 == 0x76) {
          return 'v';
        }
        if (bVar1 == 0x73) {
          return 'u';
        }
      }
    }
  }
  return '\0';
}

Assistant:

char mcplcfg_decode_modeflag( const char* flag )
{
  //Decode primary mode flag
#define MCPLCFG_MODE_HELP 'h'
#define MCPLCFG_MODE_VERSION 'v'
#define MCPLCFG_MODE_INTVERSION 'i'
#define MCPLCFG_MODE_SUMMARY 'u'
#define MCPLCFG_MODE_SHOW 's'
#define MCPLCFG_MODE_INVALID '\0'
  if ( flag[0] != '-' )
    return MCPLCFG_MODE_INVALID;
  ++flag;
  if ( flag[0] == '-' ) {
    //long option
    ++flag;
#define MCPLCFG_STREQUALCONST(a,b) (a[0]==b[0] && strncmp(a,b,sizeof(b))==0)
#define MCPLCFG_STREQUAL(a,b) (a[0]==b[0] && strcmp(a,b)==0)

    if ( MCPLCFG_STREQUALCONST( flag, "show" ) )
      return MCPLCFG_MODE_SHOW;

    if ( MCPLCFG_STREQUALCONST( flag, "version" ) )
      return MCPLCFG_MODE_VERSION;

    if ( MCPLCFG_STREQUALCONST( flag, "intversion" ) )
      return MCPLCFG_MODE_INTVERSION;

    if ( MCPLCFG_STREQUALCONST( flag, "summary" ) )
      return MCPLCFG_MODE_SUMMARY;

    if ( MCPLCFG_STREQUALCONST( flag, "help" ) )
      return MCPLCFG_MODE_HELP;

    return MCPLCFG_MODE_INVALID;
  } else {
    //short option
    if (strlen(flag)!=1)
      return MCPLCFG_MODE_INVALID;
    switch( flag[0] ) {
    case 'h': return MCPLCFG_MODE_HELP;
    case 'v': return MCPLCFG_MODE_VERSION;
    case 'i': return MCPLCFG_MODE_INTVERSION;
    case 's': return MCPLCFG_MODE_SUMMARY;
    default:
      return MCPLCFG_MODE_INVALID;
    }
  }
}